

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

TValue * mmcall(lua_State *L,ASMFunction cont,cTValue *mo,cTValue *a,cTValue *b)

{
  TValue *pTVar1;
  ulong uVar2;
  
  uVar2 = L->base[-2].u64 & 0x7fffffffffff;
  if (*(char *)(uVar2 + 10) == '\0') {
    pTVar1 = L->base + *(byte *)(*(long *)(uVar2 + 0x20) + -0x5d);
  }
  else {
    pTVar1 = L->top;
  }
  *pTVar1 = (TValue)cont;
  pTVar1[1].u64 = 0xffffffffffffffff;
  pTVar1[2] = *mo;
  pTVar1[3].u64 = 0xffffffffffffffff;
  pTVar1[4] = *a;
  pTVar1[5] = *b;
  return pTVar1 + 4;
}

Assistant:

static TValue *mmcall(lua_State *L, ASMFunction cont, cTValue *mo,
		    cTValue *a, cTValue *b)
{
  /*
  **           |-- framesize -> top       top+1       top+2 top+3
  ** before:   [func slots ...]
  ** mm setup: [func slots ...] [cont|?]  [mo|tmtype] [a]   [b]
  ** in asm:   [func slots ...] [cont|PC] [mo|delta]  [a]   [b]
  **           ^-- func base                          ^-- mm base
  ** after mm: [func slots ...]           [result]
  **                ^-- copy to base[PC_RA] --/     for lj_cont_ra
  **                          istruecond + branch   for lj_cont_cond*
  **                                       ignore   for lj_cont_nop
  ** next PC:  [func slots ...]
  */
  TValue *top = L->top;
  if (curr_funcisL(L)) top = curr_topL(L);
  setcont(top++, cont);  /* Assembler VM stores PC in upper word or FR2. */
  if (LJ_FR2) setnilV(top++);
  copyTV(L, top++, mo);  /* Store metamethod and two arguments. */
  if (LJ_FR2) setnilV(top++);
  copyTV(L, top, a);
  copyTV(L, top+1, b);
  return top;  /* Return new base. */
}